

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gf256.cpp
# Opt level: O1

void gf256_addset_mem(void *vz,void *vx,void *vy,int bytes)

{
  uint *puVar1;
  uint *puVar2;
  uint *puVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  uint uVar34;
  ulong uVar35;
  long lVar36;
  
  if (CpuHasAVX2) {
    uVar34 = bytes;
    if (bytes < 0) {
      uVar34 = bytes + 0x1fU;
    }
    uVar34 = (int)uVar34 >> 5;
    if (0x3e < bytes + 0x1fU) {
      lVar36 = 0;
      do {
        puVar1 = (uint *)((long)vy + lVar36);
        uVar5 = puVar1[1];
        uVar6 = puVar1[2];
        uVar7 = puVar1[3];
        uVar8 = puVar1[4];
        uVar9 = puVar1[5];
        uVar10 = puVar1[6];
        uVar11 = puVar1[7];
        puVar2 = (uint *)((long)vx + lVar36);
        uVar12 = puVar2[1];
        uVar13 = puVar2[2];
        uVar14 = puVar2[3];
        uVar15 = puVar2[4];
        uVar16 = puVar2[5];
        uVar17 = puVar2[6];
        uVar18 = puVar2[7];
        puVar3 = (uint *)((long)vz + lVar36);
        *puVar3 = *puVar1 ^ *puVar2;
        puVar3[1] = uVar5 ^ uVar12;
        puVar3[2] = uVar6 ^ uVar13;
        puVar3[3] = uVar7 ^ uVar14;
        puVar3[4] = uVar8 ^ uVar15;
        puVar3[5] = uVar9 ^ uVar16;
        puVar3[6] = uVar10 ^ uVar17;
        puVar3[7] = uVar11 ^ uVar18;
        lVar36 = lVar36 + 0x20;
      } while ((ulong)(uVar34 + (uVar34 == 0)) << 5 != lVar36);
    }
    bytes = bytes + uVar34 * -0x20;
    lVar36 = (ulong)uVar34 * 0x20;
    vz = (void *)((long)vz + lVar36);
    vx = (void *)((long)vx + lVar36);
    vy = (void *)((long)vy + lVar36);
  }
  else {
    uVar34 = bytes;
    if (0x3f < bytes) {
      do {
        uVar5 = *(uint *)((long)vy + 4);
        uVar35 = *(ulong *)((long)vy + 8);
        uVar6 = *(uint *)((long)vy + 0xc);
        uVar21 = *(ulong *)((long)vy + 0x10);
        uVar7 = *(uint *)((long)vy + 0x14);
        uVar22 = *(ulong *)((long)vy + 0x18);
        uVar8 = *(uint *)((long)vy + 0x1c);
        uVar23 = *(ulong *)((long)vy + 0x20);
        uVar9 = *(uint *)((long)vy + 0x24);
        uVar24 = *(ulong *)((long)vy + 0x28);
        uVar10 = *(uint *)((long)vy + 0x2c);
        uVar25 = *(ulong *)((long)vy + 0x30);
        uVar11 = *(uint *)((long)vy + 0x34);
        uVar26 = *(ulong *)((long)vy + 0x38);
        uVar12 = *(uint *)((long)vy + 0x3c);
        uVar13 = *(uint *)((long)vx + 4);
        uVar27 = *(ulong *)((long)vx + 8);
        uVar14 = *(uint *)((long)vx + 0xc);
        uVar28 = *(ulong *)((long)vx + 0x10);
        uVar15 = *(uint *)((long)vx + 0x14);
        uVar29 = *(ulong *)((long)vx + 0x18);
        uVar16 = *(uint *)((long)vx + 0x1c);
        uVar30 = *(ulong *)((long)vx + 0x20);
        uVar17 = *(uint *)((long)vx + 0x24);
        uVar31 = *(ulong *)((long)vx + 0x28);
        uVar18 = *(uint *)((long)vx + 0x2c);
        uVar32 = *(ulong *)((long)vx + 0x30);
        uVar19 = *(uint *)((long)vx + 0x34);
        uVar33 = *(ulong *)((long)vx + 0x38);
        uVar20 = *(uint *)((long)vx + 0x3c);
        *(uint *)vz = (uint)*vy ^ (uint)*vx;
        *(uint *)((long)vz + 4) = uVar5 ^ uVar13;
        *(uint *)((long)vz + 8) = (uint)uVar35 ^ (uint)uVar27;
        *(uint *)((long)vz + 0xc) = uVar6 ^ uVar14;
        *(uint *)((long)vz + 0x10) = (uint)uVar21 ^ (uint)uVar28;
        *(uint *)((long)vz + 0x14) = uVar7 ^ uVar15;
        *(uint *)((long)vz + 0x18) = (uint)uVar22 ^ (uint)uVar29;
        *(uint *)((long)vz + 0x1c) = uVar8 ^ uVar16;
        *(uint *)((long)vz + 0x20) = (uint)uVar23 ^ (uint)uVar30;
        *(uint *)((long)vz + 0x24) = uVar9 ^ uVar17;
        *(uint *)((long)vz + 0x28) = (uint)uVar24 ^ (uint)uVar31;
        *(uint *)((long)vz + 0x2c) = uVar10 ^ uVar18;
        *(uint *)((long)vz + 0x30) = (uint)uVar25 ^ (uint)uVar32;
        *(uint *)((long)vz + 0x34) = uVar11 ^ uVar19;
        *(uint *)((long)vz + 0x38) = (uint)uVar26 ^ (uint)uVar33;
        *(uint *)((long)vz + 0x3c) = uVar12 ^ uVar20;
        bytes = uVar34 - 0x40;
        vx = (void *)((long)vx + 0x40);
        vy = (void *)((long)vy + 0x40);
        vz = (void *)((long)vz + 0x40);
        bVar4 = 0x7f < (int)uVar34;
        uVar34 = bytes;
      } while (bVar4);
    }
  }
  uVar34 = bytes;
  if (0xf < bytes) {
    do {
      uVar5 = *(uint *)((long)vy + 4);
      uVar35 = *(ulong *)((long)vy + 8);
      uVar6 = *(uint *)((long)vy + 0xc);
      uVar7 = *(uint *)((long)vx + 4);
      uVar21 = *(ulong *)((long)vx + 8);
      uVar8 = *(uint *)((long)vx + 0xc);
      *(uint *)vz = (uint)*vy ^ (uint)*vx;
      *(uint *)((long)vz + 4) = uVar5 ^ uVar7;
      *(uint *)((long)vz + 8) = (uint)uVar35 ^ (uint)uVar21;
      *(uint *)((long)vz + 0xc) = uVar6 ^ uVar8;
      bytes = uVar34 - 0x10;
      vx = (void *)((long)vx + 0x10);
      vy = (void *)((long)vy + 0x10);
      vz = (void *)((long)vz + 0x10);
      bVar4 = 0x1f < (int)uVar34;
      uVar34 = bytes;
    } while (bVar4);
  }
  uVar35 = (ulong)(bytes & 8U);
  if ((bytes & 8U) != 0) {
    *(ulong *)vz = *vy ^ *vx;
  }
  if ((bytes & 4U) != 0) {
    *(uint *)((long)vz + uVar35) = *(uint *)((long)vy + uVar35) ^ *(uint *)((long)vx + uVar35);
  }
  uVar35 = (ulong)(bytes & 0xc);
  switch(bytes & 3) {
  case 0:
    return;
  case 3:
    *(byte *)((long)vz + uVar35 + 2) =
         *(byte *)((long)vy + uVar35 + 2) ^ *(byte *)((long)vx + uVar35 + 2);
  case 2:
    *(byte *)((long)vz + uVar35 + 1) =
         *(byte *)((long)vy + uVar35 + 1) ^ *(byte *)((long)vx + uVar35 + 1);
  case 1:
    *(byte *)((long)vz + uVar35) = *(byte *)((long)vy + uVar35) ^ *(byte *)((long)vx + uVar35);
    return;
  }
}

Assistant:

void gf256_addset_mem(void * GF256_RESTRICT vz, const void * GF256_RESTRICT vx,
                                 const void * GF256_RESTRICT vy, int bytes)
{
    GF256_M128 * GF256_RESTRICT z16 = reinterpret_cast<GF256_M128*>(vz);
    const GF256_M128 * GF256_RESTRICT x16 = reinterpret_cast<const GF256_M128*>(vx);
    const GF256_M128 * GF256_RESTRICT y16 = reinterpret_cast<const GF256_M128*>(vy);

#if defined(GF256_TARGET_MOBILE)
# if defined(GF256_TRY_NEON)
    // Handle multiples of 64 bytes
    if (CpuHasNeon)
    {
        while (bytes >= 64)
        {
            GF256_M128 x0 = vld1q_u8((uint8_t*)x16);
            GF256_M128 x1 = vld1q_u8((uint8_t*)(x16 + 1));
            GF256_M128 x2 = vld1q_u8((uint8_t*)(x16 + 2));
            GF256_M128 x3 = vld1q_u8((uint8_t*)(x16 + 3));
            GF256_M128 y0 = vld1q_u8((uint8_t*)(y16));
            GF256_M128 y1 = vld1q_u8((uint8_t*)(y16 + 1));
            GF256_M128 y2 = vld1q_u8((uint8_t*)(y16 + 2));
            GF256_M128 y3 = vld1q_u8((uint8_t*)(y16 + 3));

            vst1q_u8((uint8_t*)z16,     veorq_u8(x0, y0));
            vst1q_u8((uint8_t*)(z16 + 1), veorq_u8(x1, y1));
            vst1q_u8((uint8_t*)(z16 + 2), veorq_u8(x2, y2));
            vst1q_u8((uint8_t*)(z16 + 3), veorq_u8(x3, y3));

            bytes -= 64, x16 += 4, y16 += 4, z16 += 4;
        }

        // Handle multiples of 16 bytes
        while (bytes >= 16)
        {
            // z[i] = x[i] xor y[i]
            vst1q_u8((uint8_t*)z16,
                     veorq_u8(
                         vld1q_u8((uint8_t*)x16),
                         vld1q_u8((uint8_t*)y16)));

            bytes -= 16, ++x16, ++y16, ++z16;
        }
    }
    else
# endif // GF256_TRY_NEON
    {
        uint64_t * GF256_RESTRICT z8 = reinterpret_cast<uint64_t *>(z16);
        const uint64_t * GF256_RESTRICT x8 = reinterpret_cast<const uint64_t *>(x16);
        const uint64_t * GF256_RESTRICT y8 = reinterpret_cast<const uint64_t *>(y16);

        const unsigned count = (unsigned)bytes / 8;
        for (unsigned ii = 0; ii < count; ++ii)
            z8[ii] = x8[ii] ^ y8[ii];

        x16 = reinterpret_cast<const GF256_M128 *>(x8 + count);
        y16 = reinterpret_cast<const GF256_M128 *>(y8 + count);
        z16 = reinterpret_cast<GF256_M128 *>(z8 + count);

        bytes -= (count * 8);
    }
#else // GF256_TARGET_MOBILE
# if defined(GF256_TRY_AVX2)
    if (CpuHasAVX2)
    {
        GF256_M256 * GF256_RESTRICT z32 = reinterpret_cast<GF256_M256 *>(z16);
        const GF256_M256 * GF256_RESTRICT x32 = reinterpret_cast<const GF256_M256 *>(x16);
        const GF256_M256 * GF256_RESTRICT y32 = reinterpret_cast<const GF256_M256 *>(y16);

        const unsigned count = bytes / 32;
        for (unsigned i = 0; i < count; ++i)
        {
            _mm256_storeu_si256(z32 + i,
                _mm256_xor_si256(
                    _mm256_loadu_si256(x32 + i),
                    _mm256_loadu_si256(y32 + i)));
        }

        bytes -= count * 32;
        z16 = reinterpret_cast<GF256_M128 *>(z32 + count);
        x16 = reinterpret_cast<const GF256_M128 *>(x32 + count);
        y16 = reinterpret_cast<const GF256_M128 *>(y32 + count);
    }
    else
# endif // GF256_TRY_AVX2
    {
        // Handle multiples of 64 bytes
        while (bytes >= 64)
        {
            GF256_M128 x0 = _mm_loadu_si128(x16);
            GF256_M128 x1 = _mm_loadu_si128(x16 + 1);
            GF256_M128 x2 = _mm_loadu_si128(x16 + 2);
            GF256_M128 x3 = _mm_loadu_si128(x16 + 3);
            GF256_M128 y0 = _mm_loadu_si128(y16);
            GF256_M128 y1 = _mm_loadu_si128(y16 + 1);
            GF256_M128 y2 = _mm_loadu_si128(y16 + 2);
            GF256_M128 y3 = _mm_loadu_si128(y16 + 3);

            _mm_storeu_si128(z16,     _mm_xor_si128(x0, y0));
            _mm_storeu_si128(z16 + 1, _mm_xor_si128(x1, y1));
            _mm_storeu_si128(z16 + 2, _mm_xor_si128(x2, y2));
            _mm_storeu_si128(z16 + 3, _mm_xor_si128(x3, y3));

            bytes -= 64, x16 += 4, y16 += 4, z16 += 4;
        }
    }

    // Handle multiples of 16 bytes
    while (bytes >= 16)
    {
        // z[i] = x[i] xor y[i]
        _mm_storeu_si128(z16,
            _mm_xor_si128(
                _mm_loadu_si128(x16),
                _mm_loadu_si128(y16)));

        bytes -= 16, ++x16, ++y16, ++z16;
    }
#endif // GF256_TARGET_MOBILE

    uint8_t * GF256_RESTRICT z1 = reinterpret_cast<uint8_t *>(z16);
    const uint8_t * GF256_RESTRICT x1 = reinterpret_cast<const uint8_t *>(x16);
    const uint8_t * GF256_RESTRICT y1 = reinterpret_cast<const uint8_t *>(y16);

    // Handle a block of 8 bytes
    const int eight = bytes & 8;
    if (eight)
    {
        uint64_t * GF256_RESTRICT z8 = reinterpret_cast<uint64_t *>(z1);
        const uint64_t * GF256_RESTRICT x8 = reinterpret_cast<const uint64_t *>(x1);
        const uint64_t * GF256_RESTRICT y8 = reinterpret_cast<const uint64_t *>(y1);
        *z8 = *x8 ^ *y8;
    }

    // Handle a block of 4 bytes
    const int four = bytes & 4;
    if (four)
    {
        uint32_t * GF256_RESTRICT z4 = reinterpret_cast<uint32_t *>(z1 + eight);
        const uint32_t * GF256_RESTRICT x4 = reinterpret_cast<const uint32_t *>(x1 + eight);
        const uint32_t * GF256_RESTRICT y4 = reinterpret_cast<const uint32_t *>(y1 + eight);
        *z4 = *x4 ^ *y4;
    }

    // Handle final bytes
    const int offset = eight + four;
    switch (bytes & 3)
    {
    case 3: z1[offset + 2] = x1[offset + 2] ^ y1[offset + 2];
    case 2: z1[offset + 1] = x1[offset + 1] ^ y1[offset + 1];
    case 1: z1[offset] = x1[offset] ^ y1[offset];
    default:
        break;
    }
}